

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_zip_error mz_zip_set_last_error(mz_zip_archive *pZip,mz_zip_error err_num)

{
  mz_zip_error prev_err;
  mz_zip_error err_num_local;
  mz_zip_archive *pZip_local;
  
  if (pZip == (mz_zip_archive *)0x0) {
    pZip_local._4_4_ = MZ_ZIP_INVALID_PARAMETER;
  }
  else {
    pZip_local._4_4_ = pZip->m_last_error;
    pZip->m_last_error = err_num;
  }
  return pZip_local._4_4_;
}

Assistant:

mz_zip_error mz_zip_set_last_error(mz_zip_archive *pZip, mz_zip_error err_num) {
  mz_zip_error prev_err;

  if (!pZip)
    return MZ_ZIP_INVALID_PARAMETER;

  prev_err = pZip->m_last_error;

  pZip->m_last_error = err_num;
  return prev_err;
}